

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo_tests.cpp
# Opt level: O0

void density_tests::lifo_test_thread_proc
               (QueueTesterFlags i_flags,EasyRandom *i_random,size_t i_depth,size_t i_fork_depth)

{
  bool bVar1;
  function<void_()> local_68;
  undefined1 local_48 [8];
  anon_class_24_3_86bce9c5 do_tests;
  mt19937 *std_rand;
  size_t i_fork_depth_local;
  size_t i_depth_local;
  EasyRandom *i_random_local;
  QueueTesterFlags i_flags_local;
  
  local_48 = (undefined1  [8])EasyRandom::underlying_rand(i_random);
  do_tests.std_rand = (mt19937 *)i_depth;
  do_tests.i_depth = i_fork_depth;
  do_tests.i_fork_depth = (size_t)local_48;
  bVar1 = operator&&(i_flags,eTestExceptions);
  if (bVar1) {
    std::function<void()>::
    function<density_tests::lifo_test_thread_proc(density_tests::QueueTesterFlags,density_tests::EasyRandom&,unsigned_long,unsigned_long)::__0&,void>
              ((function<void()> *)&local_68,(anon_class_24_3_86bce9c5 *)local_48);
    run_exception_test(&local_68);
    std::function<void_()>::~function(&local_68);
  }
  else {
    lifo_test_thread_proc::anon_class_24_3_86bce9c5::operator()
              ((anon_class_24_3_86bce9c5 *)local_48);
  }
  return;
}

Assistant:

void lifo_test_thread_proc(
      QueueTesterFlags i_flags, EasyRandom & i_random, size_t i_depth, size_t i_fork_depth)
    {
        const auto & std_rand = i_random.underlying_rand();

        // local function that executes the tests
        auto do_tests = [&std_rand, i_depth, i_fork_depth] {
            auto rand_copy = std_rand;
            RecursiveLifoTests::recursive_test(rand_copy, i_depth, i_fork_depth);
        };

        // check if we should run the normal test or the exhaustive exception test
        if (i_flags && QueueTesterFlags::eTestExceptions)
        {
            run_exception_test(std::function<void()>(do_tests));
        }
        else
        {
            do_tests();
        }
    }